

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint64_t helper_float_rsqrt1_ps_mips(CPUMIPSState *env,uint64_t fdt0)

{
  float32 fVar1;
  float32 fVar2;
  uintptr_t unaff_retaddr;
  uint32_t fsth2;
  uint32_t fst2;
  uint64_t fdt0_local;
  CPUMIPSState *env_local;
  
  fVar1 = float32_sqrt_mips((float32)fdt0,&(env->active_fpu).fp_status);
  fVar2 = float32_sqrt_mips((float32)(fdt0 >> 0x20),&(env->active_fpu).fp_status);
  fVar1 = float32_div_mips(0x3f800000,fVar1,&(env->active_fpu).fp_status);
  fVar2 = float32_div_mips(0x3f800000,fVar2,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return CONCAT44(fVar2,fVar1);
}

Assistant:

uint64_t helper_float_rsqrt1_ps(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t fst2;
    uint32_t fsth2;

    fst2 = float32_sqrt(fdt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    fsth2 = float32_sqrt(fdt0 >> 32, &env->active_fpu.fp_status);
    fst2 = float32_div(float32_one, fst2, &env->active_fpu.fp_status);
    fsth2 = float32_div(float32_one, fsth2, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());
    return ((uint64_t)fsth2 << 32) | fst2;
}